

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

lword readsection(GlobalVars *gv,uint8_t rtype,uint8_t *src,RelocInsert *ri)

{
  char cVar1;
  long x;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  lword lVar5;
  uint n;
  
  cVar1 = gv->endianess;
  if (ri == (RelocInsert *)0x0) {
    n = 0;
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    n = 0;
    do {
      x = ri->mask;
      if (x == -1) {
        uVar3 = (uint)ri->bsiz;
      }
      else {
        iVar2 = highest_bit_set(x);
        uVar3 = iVar2 + 1;
      }
      if ((int)n < (int)uVar3) {
        n = uVar3;
      }
      uVar4 = readreloc((uint)(cVar1 != '\0'),src,(uint)ri->bpos,(uint)ri->bsiz);
      iVar2 = lshiftcnt(x);
      lVar5 = lVar5 + ((x >> ((byte)iVar2 & 0x3f) & uVar4) << ((byte)iVar2 & 0x3f));
      ri = ri->next;
    } while (ri != (RelocInsert *)0x0);
  }
  if ((rtype < 0x22) && ((0x300000400U >> ((ulong)rtype & 0x3f) & 1) != 0)) {
    return lVar5;
  }
  lVar5 = sign_extend(lVar5,n);
  return lVar5;
}

Assistant:

lword readsection(struct GlobalVars *gv,uint8_t rtype,uint8_t *src,
                  struct RelocInsert *ri)
/* Read data from section at 'src', using the field-offsets, sizes and masks
   from the supplied list of RelocInsert structures. */
{
  int be = gv->endianess != _LITTLE_ENDIAN_;
  int maxfldsz = 0;
  lword data = 0;

  while (ri != NULL) {
    lword mask = ri->mask;
    lword v;
    int n;

    n = mask==-1 ? (int)ri->bsiz : highest_bit_set(mask) + 1;
    if (n > maxfldsz)
      maxfldsz = n;

    /* read from bitfield */
    v = readreloc(be,src,ri->bpos,ri->bsiz);

    /* mask and denormalize the read value using 'mask' */
    n = lshiftcnt(mask);
    mask >>= n;
    v &= mask;
    v <<= n;

    /* add to data value, next RelocInsert */
    data += v;
    ri = ri->next;
  }

  /* sign-extend, when needed */
  if (rtype!=R_SD && rtype!=R_SD2 && rtype!=R_SD21)
    return sign_extend(data,maxfldsz);

  return data;
}